

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68020_cpdbcc(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  uint in_EDI;
  uint uVar6;
  
  uVar1 = g_cpu_pc;
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar2 = dasm_read_imm_16(in_EDI);
    uVar3 = dasm_read_imm_16(in_EDI);
    uVar4 = dasm_read_imm_16(in_EDI);
    uVar6 = g_cpu_ir >> 9;
    pcVar5 = g_cpcc[uVar2 & 0x3f];
    uVar2 = g_cpu_ir & 7;
    get_imm_str_s(1);
    sprintf(g_dasm_str,"%ddb%-4s D%d,%s; $%x (extension = $%x) (2-3)",(ulong)(uVar6 & 7),pcVar5,
            (ulong)uVar2,get_imm_str_s::str,
            (ulong)(((uint)(uVar4 < 0x8000) * 0x10000 + uVar1 + uVar4) - 0x10000),(ulong)uVar3);
    return;
  }
  if ((~g_cpu_ir & 0xf000) == 0) {
    pcVar5 = "dc.w    $%04x; opcode 1111";
  }
  else {
    pcVar5 = "dc.w $%04x; ILLEGAL";
  }
  sprintf(g_dasm_str,pcVar5);
  return;
}

Assistant:

static void d68020_cpdbcc(void)
{
	uint extension1;
	uint extension2;
	uint new_pc = g_cpu_pc;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	new_pc += make_int_16(read_imm_16());
	sprintf(g_dasm_str, "%ddb%-4s D%d,%s; $%x (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], g_cpu_ir&7, get_imm_str_s16(), new_pc, extension2);
}